

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simple_object_pool.h
# Opt level: O0

pointer __thiscall
Gudhi::
Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false>>>>
::construct<unsigned_int&,unsigned_int&>
          (Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false>>>>
           *this,uint *u,uint *u_1)

{
  Base *this_00;
  Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>
  *this_01;
  uint *__size;
  void *p;
  uint *u_local_1;
  uint *u_local;
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>_>
  *this_local;
  
  __size = u;
  this_00 = Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>_>
            ::base((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>_>
                    *)this);
  this_01 = (Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>
             *)boost::pool<boost::default_user_allocator_malloc_free>::malloc
                         (this_00,(size_t)__size);
  if (this_01 !=
      (Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>
       *)0x0) {
    persistence_matrix::
    Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>
    ::Entry(this_01,*u,*u_1);
    return this_01;
  }
  __assert_fail("p",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/common/include/gudhi/Simple_object_pool.h"
                ,0x33,
                "pointer Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true, true, false, false>>>>::construct(U &&...) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true, true, false, false>>>, U = <unsigned int &, unsigned int &>]"
               );
}

Assistant:

pointer construct(U&&...u) {
    void* p = base().malloc BOOST_PREVENT_MACRO_SUBSTITUTION();
    assert(p);
    try {
      new(p) T(std::forward<U>(u)...);
    }    catch (...) {
      base().free BOOST_PREVENT_MACRO_SUBSTITUTION(p);
      throw;
    }
    return static_cast<pointer> (p);
  }